

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O2

int google::protobuf::UnescapeCEscapeString
              (string *src,string *dest,
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *errors)

{
  int iVar1;
  scoped_array<char> dest_00;
  LogMessage *other;
  LogFinisher local_69;
  scoped_array<char> unescaped;
  LogMessage local_60;
  
  dest_00.array_ = (char *)operator_new__(src->_M_string_length + 1);
  unescaped.array_ = dest_00.array_;
  iVar1 = UnescapeCEscapeSequences((src->_M_dataplus)._M_p,dest_00.array_,errors);
  if (dest == (string *)0x0) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/stubs/strutil.cc"
               ,0x1da);
    other = internal::LogMessage::operator<<(&local_60,"CHECK failed: dest: ");
    internal::LogFinisher::operator=(&local_69,other);
    internal::LogMessage::~LogMessage(&local_60);
    dest_00 = unescaped;
  }
  std::__cxx11::string::assign((char *)dest,(ulong)dest_00.array_);
  internal::scoped_array<char>::~scoped_array(&unescaped);
  return iVar1;
}

Assistant:

int UnescapeCEscapeString(const string& src, string* dest,
                          vector<string> *errors) {
  scoped_array<char> unescaped(new char[src.size() + 1]);
  int len = UnescapeCEscapeSequences(src.c_str(), unescaped.get(), errors);
  GOOGLE_CHECK(dest);
  dest->assign(unescaped.get(), len);
  return len;
}